

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void __thiscall Overlay_Window::draw(Overlay_Window *this)

{
  byte bVar1;
  uint uVar2;
  undefined8 uVar3;
  uint uVar4;
  ulong uVar5;
  
  if ((char)(this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.super_Fl_Group.
            super_Fl_Widget.damage_ < '\0') {
    bVar1 = (this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.super_Fl_Group.
            super_Fl_Widget.box_;
    if (bVar1 != 0) {
      if ((bVar1 < 0x12) && (bVar1 < 4 || (bVar1 & 2) != 0)) goto LAB_0018b4cb;
    }
    if (0 < (this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.super_Fl_Group.
            super_Fl_Widget.h_) {
      uVar2 = 0;
      do {
        if (0 < (this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.
                super_Fl_Group.super_Fl_Widget.w_) {
          uVar5 = 0;
          do {
            uVar3 = 0xff;
            if ((((uint)uVar5 ^ uVar2) & 0x10) == 0) {
              uVar3 = 0x38;
            }
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,uVar3)
            ;
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                      (fl_graphics_driver,uVar5,(ulong)uVar2,8,8);
            uVar4 = (uint)uVar5 + 8;
            uVar5 = (ulong)uVar4;
          } while ((int)uVar4 <
                   (this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.
                   super_Fl_Group.super_Fl_Widget.w_);
        }
        uVar2 = uVar2 + 8;
      } while ((int)uVar2 <
               (this->super_Fl_Overlay_Window).super_Fl_Double_Window.super_Fl_Window.super_Fl_Group
               .super_Fl_Widget.h_);
    }
  }
LAB_0018b4cb:
  Fl_Window::draw((Fl_Window *)this);
  return;
}

Assistant:

void Overlay_Window::draw() {
  const int CHECKSIZE = 8;
  // see if box is clear or a frame or rounded:
  if ((damage()&FL_DAMAGE_ALL) &&
      (!box() || (box()>=4&&!(box()&2)) || box()>=_FL_ROUNDED_BOX)) {
    // if so, draw checkerboard so user can see what areas are clear:
    for (int Y = 0; Y < h(); Y += CHECKSIZE) 
      for (int X = 0; X < w(); X += CHECKSIZE) {
	fl_color(((Y/(2*CHECKSIZE))&1) != ((X/(2*CHECKSIZE))&1) ?
		 FL_WHITE : FL_BLACK);
	fl_rectf(X,Y,CHECKSIZE,CHECKSIZE);
      }
  }
  Fl_Overlay_Window::draw();
}